

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pokey.c
# Opt level: O0

UINT8 pokey_r(void *info,UINT8 offset)

{
  UINT32 adjust;
  int pot;
  int data;
  pokey_state *p;
  UINT8 offset_local;
  void *info_local;
  
  adjust._0_1_ = 0;
  switch(offset & 0xf) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    break;
  case 8:
    if ((*(byte *)((long)info + 0xa4) & 3) == 0) {
      adjust._0_1_ = 0;
    }
    else {
      adjust._0_1_ = *(byte *)((long)info + 0x9c);
    }
    break;
  case 9:
    adjust._0_1_ = *(byte *)((long)info + 0x9d);
    break;
  case 10:
    if ((*(byte *)((long)info + 0xa4) & 3) == 0) {
      *(undefined4 *)((long)info + 100) = 0;
      *(undefined4 *)((long)info + 0x68) = 0;
    }
    else {
      *(uint *)((long)info + 100) = *(uint *)((long)info + 100) % 0x1ff;
      *(uint *)((long)info + 0x68) = *(uint *)((long)info + 0x68) % 0x1ffff;
    }
    if ((*(byte *)((long)info + 0x9b) & 0x80) == 0) {
      *(undefined1 *)((long)info + 0x9e) =
           *(undefined1 *)((long)info + (ulong)*(uint *)((long)info + 0x68) + 0x204db);
    }
    else {
      *(undefined1 *)((long)info + 0x9e) =
           *(undefined1 *)((long)info + (ulong)*(uint *)((long)info + 100) + 0x202dc);
    }
    adjust._0_1_ = *(byte *)((long)info + 0x9e) ^ 0xff;
    break;
  default:
    break;
  case 0xd:
    adjust._0_1_ = *(byte *)((long)info + 0x9f);
    break;
  case 0xe:
    adjust._0_1_ = *(byte *)((long)info + 0xa1) ^ 0xff;
    break;
  case 0xf:
    adjust._0_1_ = *(byte *)((long)info + 0xa3) ^ 0xff;
  }
  return (byte)adjust;
}

Assistant:

static UINT8 pokey_r(void *info, UINT8 offset)
{
	pokey_state *p = (pokey_state *)info;
	int data = 0, pot;
	UINT32 adjust = 0;

	switch (offset & 15)
	{
	case POT0_C: case POT1_C: case POT2_C: case POT3_C:
	case POT4_C: case POT5_C: case POT6_C: case POT7_C:
		pot = offset & 7;
		break;

	case ALLPOT_C:
		/****************************************************************
		 * If the 2 least significant bits of SKCTL are 0, the ALLPOTs
		 * are disabled (SKRESET). Thanks to MikeJ for pointing this out.
		 ****************************************************************/
		if( (p->SKCTL & SK_RESET) == 0)
		{
			data = 0;
			//LOG(("POKEY '%s' ALLPOT internal $%02x (reset)\n", p->device->tag(), data));
		}
		else
		{
			data = p->ALLPOT;
			//LOG(("POKEY '%s' ALLPOT internal $%02x\n", p->device->tag(), data));
		}
		break;

	case KBCODE_C:
		data = p->KBCODE;
		break;

	case RANDOM_C:
		/****************************************************************
		 * If the 2 least significant bits of SKCTL are 0, the random
		 * number generator is disabled (SKRESET). Thanks to Eric Smith
		 * for pointing out this critical bit of info! If the random
		 * number generator is enabled, get a new random number. Take
		 * the time gone since the last read into account and read the
		 * new value from an appropriate offset in the rand17 table.
		 ****************************************************************/
		if( p->SKCTL & SK_RESET )
		{
			//adjust = p->rtimer->elapsed().as_double() / p->clock_period.as_double();
			adjust = 0;
			p->r9 = (p->r9 + adjust) % 0x001ff;
			p->r17 = (p->r17 + adjust) % 0x1ffff;
		}
		else
		{
			adjust = 1;
			p->r9 = 0;
			p->r17 = 0;
			//LOG_RAND(("POKEY '%s' rand17 frozen (SKCTL): $%02x\n", p->device->tag(), p->RANDOM));
		}
		if( p->AUDCTL & POLY9 )
		{
			p->RANDOM = p->rand9[p->r9];
			//LOG_RAND(("POKEY '%s' adjust %u rand9[$%05x]: $%02x\n", p->device->tag(), adjust, p->r9, p->RANDOM));
		}
		else
		{
			p->RANDOM = p->rand17[p->r17];
			//LOG_RAND(("POKEY '%s' adjust %u rand17[$%05x]: $%02x\n", p->device->tag(), adjust, p->r17, p->RANDOM));
		}
		//if (adjust > 0)
		//	p->rtimer->adjust(attotime::never);
		data = p->RANDOM ^ 0xff;
		break;

	case SERIN_C:
		data = p->SERIN;
		//LOG(("POKEY '%s' SERIN  $%02x\n", p->device->tag(), data));
		break;

	case IRQST_C:
		/* IRQST is an active low input port; we keep it active high */
		/* internally to ease the (un-)masking of bits */
		data = p->IRQST ^ 0xff;
		//LOG(("POKEY '%s' IRQST  $%02x\n", p->device->tag(), data));
		break;

	case SKSTAT_C:
		/* SKSTAT is also an active low input port */
		data = p->SKSTAT ^ 0xff;
		//LOG(("POKEY '%s' SKSTAT $%02x\n", p->device->tag(), data));
		break;

	default:
		//LOG(("POKEY '%s' register $%02x\n", p->device->tag(), offset));
		break;
	}
	return data;
}